

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceArrayIntersector1MB>_>
::occluded(BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceArrayIntersector1MB>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  Collider CVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  bool bVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  RayQueryContext *prim;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  Precalculations pre;
  NodeRef stack [244];
  Precalculations local_881;
  Intersectors *local_880;
  ulong local_878;
  ulong *local_870;
  Ray *local_868;
  long local_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (local_7e8 = *(float *)&(This->intersector1).intersect, 0.0 <= local_7e8)) {
    local_870 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    local_828 = *(float *)&This->ptr;
    local_838 = *(float *)((long)&This->ptr + 4);
    local_7f8 = *(float *)&This->leafIntersector;
    fVar27 = *(float *)((long)&This->leafIntersector + 4);
    CVar3 = This->collider;
    local_808 = 0.0;
    if (0.0 <= fVar27) {
      local_808 = fVar27;
    }
    auVar17._4_4_ = -(uint)(ABS(CVar3.collide._4_4_) < DAT_01f80d30._4_4_);
    auVar17._0_4_ = -(uint)(ABS(CVar3.collide._0_4_) < (float)DAT_01f80d30);
    auVar17._8_4_ = -(uint)(ABS(CVar3.name._0_4_) < DAT_01f80d30._8_4_);
    auVar17._12_4_ = -(uint)(ABS(CVar3.name._4_4_) < DAT_01f80d30._12_4_);
    auVar19 = blendvps((undefined1  [16])CVar3,_DAT_01f80d30,auVar17);
    auVar17 = rcpps(auVar17,auVar19);
    local_848 = auVar17._0_4_;
    local_858 = auVar17._4_4_;
    local_818 = auVar17._8_4_;
    local_848 = (1.0 - auVar19._0_4_ * local_848) * local_848 + local_848;
    local_858 = (1.0 - auVar19._4_4_ * local_858) * local_858 + local_858;
    local_818 = (1.0 - auVar19._8_4_ * local_818) * local_818 + local_818;
    local_878 = (ulong)(local_848 < 0.0) << 4;
    uVar12 = (ulong)(local_858 < 0.0) << 4 | 0x20;
    uVar16 = (ulong)(local_818 < 0.0) << 4 | 0x40;
    uVar13 = local_878 ^ 0x10;
    fStack_7e0 = local_7e8;
    fStack_7dc = local_7e8;
    uVar14 = local_878;
    fVar27 = local_7e8;
    fVar28 = local_7e8;
    fVar29 = local_7e8;
    fVar30 = local_7e8;
    fVar31 = local_7f8;
    fVar32 = local_7f8;
    fVar33 = local_7f8;
    fVar34 = local_7f8;
    fVar35 = local_808;
    fVar36 = local_808;
    fVar37 = local_808;
    fVar38 = local_808;
    fVar39 = local_818;
    fVar40 = local_818;
    fVar41 = local_818;
    fVar42 = local_818;
    fVar43 = local_828;
    fVar44 = local_828;
    fVar45 = local_828;
    fVar46 = local_828;
    fVar47 = local_838;
    fVar48 = local_838;
    fVar49 = local_838;
    fVar50 = local_838;
    fVar51 = local_848;
    fVar52 = local_848;
    fVar53 = local_848;
    fVar54 = local_848;
    fVar55 = local_858;
    fVar56 = local_858;
    fVar57 = local_858;
    fVar58 = local_858;
    local_880 = This;
    local_868 = ray;
    fStack_854 = local_858;
    fStack_850 = local_858;
    fStack_84c = local_858;
    fStack_844 = local_848;
    fStack_840 = local_848;
    fStack_83c = local_848;
    fStack_834 = local_838;
    fStack_830 = local_838;
    fStack_82c = local_838;
    fStack_824 = local_828;
    fStack_820 = local_828;
    fStack_81c = local_828;
    fStack_814 = local_818;
    fStack_810 = local_818;
    fStack_80c = local_818;
    fStack_804 = local_808;
    fStack_800 = local_808;
    fStack_7fc = local_808;
    fStack_7f4 = local_7f8;
    fStack_7f0 = local_7f8;
    fStack_7ec = local_7f8;
    fStack_7e4 = local_7e8;
LAB_00229a5f:
    do {
      uVar15 = local_870[-1];
      local_870 = local_870 + -1;
      while ((uVar15 & 8) == 0) {
        fVar8 = *(float *)((long)&(This->collider).name + 4);
        uVar10 = uVar15 & 0xfffffffffffffff0;
        pfVar2 = (float *)(uVar10 + 0x80 + uVar14);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar14);
        auVar20._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar43) * fVar51;
        auVar20._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar44) * fVar52;
        auVar20._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar45) * fVar53;
        auVar20._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar46) * fVar54;
        auVar23._4_4_ = fVar36;
        auVar23._0_4_ = fVar35;
        auVar23._8_4_ = fVar37;
        auVar23._12_4_ = fVar38;
        auVar17 = maxps(auVar23,auVar20);
        pfVar2 = (float *)(uVar10 + 0x80 + uVar12);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar12);
        auVar21._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar47) * fVar55;
        auVar21._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar48) * fVar56;
        auVar21._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar49) * fVar57;
        auVar21._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar50) * fVar58;
        pfVar2 = (float *)(uVar10 + 0x80 + uVar16);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar16);
        auVar24._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar31) * fVar39;
        auVar24._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar32) * fVar40;
        auVar24._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar33) * fVar41;
        auVar24._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar34) * fVar42;
        auVar19 = maxps(auVar21,auVar24);
        auVar17 = maxps(auVar17,auVar19);
        pfVar2 = (float *)(uVar10 + 0x80 + uVar13);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar13);
        auVar25._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar43) * fVar51;
        auVar25._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar44) * fVar52;
        auVar25._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar45) * fVar53;
        auVar25._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar46) * fVar54;
        auVar22._4_4_ = fVar28;
        auVar22._0_4_ = fVar27;
        auVar22._8_4_ = fVar29;
        auVar22._12_4_ = fVar30;
        auVar23 = minps(auVar22,auVar25);
        pfVar2 = (float *)(uVar10 + 0x80 + (uVar12 ^ 0x10));
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar12 ^ 0x10));
        auVar26._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar47) * fVar55;
        auVar26._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar48) * fVar56;
        auVar26._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar49) * fVar57;
        auVar26._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar50) * fVar58;
        pfVar2 = (float *)(uVar10 + 0x80 + (uVar16 ^ 0x10));
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar16 ^ 0x10));
        auVar19._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar32) * fVar40;
        auVar19._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar31) * fVar39;
        auVar19._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar33) * fVar41;
        auVar19._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar34) * fVar42;
        auVar19 = minps(auVar26,auVar19);
        auVar19 = minps(auVar23,auVar19);
        bVar9 = auVar17._0_4_ <= auVar19._0_4_;
        bVar5 = auVar17._4_4_ <= auVar19._4_4_;
        bVar6 = auVar17._8_4_ <= auVar19._8_4_;
        bVar7 = auVar17._12_4_ <= auVar19._12_4_;
        if (((uint)uVar15 & 7) == 6) {
          bVar9 = (fVar8 < *(float *)(uVar10 + 0xf0) && *(float *)(uVar10 + 0xe0) <= fVar8) && bVar9
          ;
          bVar5 = (fVar8 < *(float *)(uVar10 + 0xf4) && *(float *)(uVar10 + 0xe4) <= fVar8) && bVar5
          ;
          bVar6 = (fVar8 < *(float *)(uVar10 + 0xf8) && *(float *)(uVar10 + 0xe8) <= fVar8) && bVar6
          ;
          bVar7 = (fVar8 < *(float *)(uVar10 + 0xfc) && *(float *)(uVar10 + 0xec) <= fVar8) && bVar7
          ;
        }
        auVar18._0_4_ = (uint)bVar9 * -0x80000000;
        auVar18._4_4_ = (uint)bVar5 * -0x80000000;
        auVar18._8_4_ = (uint)bVar6 * -0x80000000;
        auVar18._12_4_ = (uint)bVar7 * -0x80000000;
        uVar11 = movmskps((int)context,auVar18);
        context = (RayQueryContext *)(ulong)uVar11;
        if (uVar11 == 0) {
          if (local_870 == &local_7d8) {
            return;
          }
          goto LAB_00229a5f;
        }
        context = (RayQueryContext *)(ulong)(byte)uVar11;
        lVar4 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((byte)uVar11 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar15 = *(ulong *)(uVar10 + lVar4 * 8);
        uVar11 = (uVar11 & 0xff) - 1 & uVar11 & 0xff;
        if (uVar11 != 0) {
          *local_870 = uVar15;
          local_870 = local_870 + 1;
          lVar4 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar10 + lVar4 * 8);
          uVar11 = uVar11 - 1 & uVar11;
          context = (RayQueryContext *)(ulong)uVar11;
          if (uVar11 != 0) {
            do {
              *local_870 = uVar15;
              local_870 = local_870 + 1;
              lVar4 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; ((ulong)context >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              uVar15 = *(ulong *)(uVar10 + lVar4 * 8);
              context = (RayQueryContext *)((ulong)context & (ulong)((long)&context[-1].args + 7U));
            } while (context != (RayQueryContext *)0x0);
          }
        }
      }
      local_860 = (ulong)((uint)uVar15 & 0xf) - 8;
      if (local_860 != 0) {
        prim = (RayQueryContext *)(uVar15 & 0xfffffffffffffff0);
        do {
          context = prim;
          bVar9 = InstanceArrayIntersector1MB::occluded
                            (&local_881,(Ray *)This,(RayQueryContext *)local_868,(Primitive *)prim);
          if (bVar9) {
            *(undefined4 *)&(local_880->intersector1).intersect = 0xff800000;
            return;
          }
          prim = (RayQueryContext *)&prim->user;
          local_860 = local_860 + -1;
          This = local_880;
        } while (local_860 != 0);
      }
      uVar14 = local_878;
      fVar27 = local_7e8;
      fVar28 = fStack_7e4;
      fVar29 = fStack_7e0;
      fVar30 = fStack_7dc;
      fVar31 = local_7f8;
      fVar32 = fStack_7f4;
      fVar33 = fStack_7f0;
      fVar34 = fStack_7ec;
      fVar35 = local_808;
      fVar36 = fStack_804;
      fVar37 = fStack_800;
      fVar38 = fStack_7fc;
      fVar39 = local_818;
      fVar40 = fStack_814;
      fVar41 = fStack_810;
      fVar42 = fStack_80c;
      fVar43 = local_828;
      fVar44 = fStack_824;
      fVar45 = fStack_820;
      fVar46 = fStack_81c;
      fVar47 = local_838;
      fVar48 = fStack_834;
      fVar49 = fStack_830;
      fVar50 = fStack_82c;
      fVar51 = local_848;
      fVar52 = fStack_844;
      fVar53 = fStack_840;
      fVar54 = fStack_83c;
      fVar55 = local_858;
      fVar56 = fStack_854;
      fVar57 = fStack_850;
      fVar58 = fStack_84c;
    } while (local_870 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }